

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void AsyncReadApt(positionTy ctr,double radius)

{
  byte bVar1;
  bool bVar2;
  logLevelTy lVar3;
  ulong uVar4;
  int *piVar5;
  undefined8 uVar6;
  size_type sVar7;
  char sErr_1 [100];
  ifstream fIn_1;
  boundingBoxTy *in_stack_000001b8;
  ifstream *in_stack_000001c0;
  string sFileName;
  char sErr [100];
  ifstream fIn;
  string lnScenery;
  ifstream fScenery;
  bool bLooksLikeXP12;
  int cntFiles;
  boundingBoxTy box;
  ThreadSettings TS;
  string *in_stack_fffffffffffff6d8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff6e0;
  uint in_stack_fffffffffffff6e4;
  undefined4 in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6ec;
  undefined4 in_stack_fffffffffffff6f0;
  undefined2 in_stack_fffffffffffff6f4;
  undefined1 in_stack_fffffffffffff6f6;
  undefined1 in_stack_fffffffffffff6f7;
  undefined4 in_stack_fffffffffffff6f8;
  undefined2 in_stack_fffffffffffff6fc;
  undefined1 in_stack_fffffffffffff6fe;
  undefined1 in_stack_fffffffffffff6ff;
  logLevelTy in_stack_fffffffffffff710;
  undefined2 in_stack_fffffffffffff714;
  byte in_stack_fffffffffffff716;
  byte in_stack_fffffffffffff717;
  logLevelTy in_stack_fffffffffffff718;
  undefined2 in_stack_fffffffffffff71c;
  byte in_stack_fffffffffffff71e;
  byte in_stack_fffffffffffff71f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  bool local_8c9;
  byte local_8b9;
  string local_8a8;
  boundingBoxTy *in_stack_fffffffffffff790;
  long local_838;
  allocator<char> local_629;
  string local_608 [32];
  string local_5e8 [3];
  long local_580 [65];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined4 local_358;
  byte local_351;
  string local_350 [32];
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  string local_2e8 [32];
  undefined1 local_2c8 [527];
  undefined1 local_b9;
  uint local_b8;
  
  ThreadSettings::ThreadSettings
            ((ThreadSettings *)
             CONCAT17(in_stack_fffffffffffff6f7,
                      CONCAT16(in_stack_fffffffffffff6f6,
                               CONCAT24(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0))),
             (char *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
             in_stack_fffffffffffff6e4,(char *)in_stack_fffffffffffff6d8);
  boundingBoxTy::boundingBoxTy
            ((boundingBoxTy *)
             CONCAT17(in_stack_fffffffffffff6f7,
                      CONCAT16(in_stack_fffffffffffff6f6,
                               CONCAT24(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0))),
             (positionTy *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
             (double)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
             (double)in_stack_fffffffffffff6d8);
  PurgeApt(in_stack_fffffffffffff790);
  local_b8 = 0;
  local_b9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff720,
             (char *)CONCAT17(in_stack_fffffffffffff71f,
                              CONCAT16(in_stack_fffffffffffff71e,
                                       CONCAT24(in_stack_fffffffffffff71c,in_stack_fffffffffffff718)
                                      )),
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff717,
                      CONCAT16(in_stack_fffffffffffff716,
                               CONCAT24(in_stack_fffffffffffff714,in_stack_fffffffffffff710))));
  LTCalcFullPath((string *)
                 CONCAT17(in_stack_fffffffffffff6ff,
                          CONCAT16(in_stack_fffffffffffff6fe,
                                   CONCAT24(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8))));
  std::ifstream::ifstream(local_2c8,local_2e8,_S_in);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  while( true ) {
    local_8b9 = 0;
    if ((bStopThread & 1U) == 0) {
      bVar1 = std::ios::good();
      local_8b9 = 0;
      if ((bVar1 & 1) != 0) {
        local_8b9 = std::ifstream::is_open();
      }
    }
    if ((local_8b9 & 1) == 0) break;
    std::__cxx11::string::string(local_330);
    safeGetline((istream *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                in_stack_fffffffffffff6d8);
    uVar4 = std::__cxx11::string::length();
    local_351 = 0;
    local_8c9 = true;
    if (AsyncReadApt::lenSceneryLnBegin < uVar4) {
      std::__cxx11::string::substr((ulong)local_350,(ulong)local_330);
      local_351 = 1;
      local_8c9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                                  (char *)in_stack_fffffffffffff6d8);
    }
    if ((local_351 & 1) != 0) {
      std::__cxx11::string::~string(local_350);
    }
    if (local_8c9 == false) {
      std::__cxx11::string::erase((ulong)local_330,0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                              (char *)in_stack_fffffffffffff6d8);
      if (bVar2) {
        local_b9 = 1;
        local_358 = 2;
      }
      else {
        LTCalcFullPath((string *)
                       CONCAT17(in_stack_fffffffffffff6ff,
                                CONCAT16(in_stack_fffffffffffff6fe,
                                         CONCAT24(in_stack_fffffffffffff6fc,
                                                  in_stack_fffffffffffff6f8))));
        in_stack_fffffffffffff720 = &local_378;
        std::__cxx11::string::operator=(local_330,(string *)in_stack_fffffffffffff720);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffff720);
        std::__cxx11::string::operator+=(local_330,"Earth nav data/apt.dat");
        std::ifstream::ifstream(local_580,local_330,_S_in);
        in_stack_fffffffffffff71f = std::ios::good();
        if (((in_stack_fffffffffffff71f & 1) != 0) &&
           (in_stack_fffffffffffff71e = std::ifstream::is_open(),
           (in_stack_fffffffffffff71e & 1) != 0)) {
          in_stack_fffffffffffff718 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)in_stack_fffffffffffff718 < 1) {
            uVar6 = std::__cxx11::string::c_str();
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                   ,0x989,"AsyncReadApt",logDEBUG,"Reading apt.dat from %s",uVar6);
          }
          ReadOneAptFile(in_stack_000001c0,in_stack_000001b8);
          local_b8 = local_b8 + 1;
        }
        in_stack_fffffffffffff717 =
             std::ios::operator!((ios *)((long)local_580 + *(long *)(local_580[0] + -0x18)));
        if ((((in_stack_fffffffffffff717 & 1) != 0) && (piVar5 = __errno_location(), *piVar5 != 2))
           && (in_stack_fffffffffffff716 = std::ios::eof(), (in_stack_fffffffffffff716 & 1) == 0)) {
          __errno_location();
          strerror_s((char *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                     (size_t)in_stack_fffffffffffff6d8,0);
          in_stack_fffffffffffff710 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)in_stack_fffffffffffff710 < 4) {
            uVar6 = std::__cxx11::string::c_str();
            in_stack_fffffffffffff6d8 = local_5e8;
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                   ,0x993,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",uVar6);
          }
        }
        std::ifstream::close();
        std::ifstream::~ifstream(local_580);
        local_358 = 0;
      }
    }
    else {
      local_358 = 2;
    }
    std::__cxx11::string::~string(local_330);
  }
  if ((bStopThread & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff720,
               (char *)CONCAT17(in_stack_fffffffffffff71f,
                                CONCAT16(in_stack_fffffffffffff71e,
                                         CONCAT24(in_stack_fffffffffffff71c,
                                                  in_stack_fffffffffffff718))),
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff717,
                        CONCAT16(in_stack_fffffffffffff716,
                                 CONCAT24(in_stack_fffffffffffff714,in_stack_fffffffffffff710))));
    LTCalcFullPath((string *)
                   CONCAT17(in_stack_fffffffffffff6ff,
                            CONCAT16(in_stack_fffffffffffff6fe,
                                     CONCAT24(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8)))
                  );
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff9d8);
    std::allocator<char>::~allocator(&local_629);
    std::ifstream::ifstream(&local_838,local_608,_S_in);
    bVar1 = std::ios::good();
    if (((bVar1 & 1) != 0) && (bVar1 = std::ifstream::is_open(), (bVar1 & 1) != 0)) {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 1) {
        uVar6 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x9a0,"AsyncReadApt",logDEBUG,"Reading global apt.dat from %s",uVar6);
      }
      ReadOneAptFile(in_stack_000001c0,in_stack_000001b8);
      local_b8 = local_b8 + 1;
    }
    bVar1 = std::ios::operator!((ios *)((long)&local_838 + *(long *)(local_838 + -0x18)));
    if (((bVar1 & 1) != 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
      __errno_location();
      strerror_s((char *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (size_t)in_stack_fffffffffffff6d8,0);
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 4) {
        uVar6 = std::__cxx11::string::c_str();
        in_stack_fffffffffffff6d8 = &local_8a8;
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
               ,0x9aa,"AsyncReadApt",logERR,"Could not read from \'%s\': %s",uVar6,
               in_stack_fffffffffffff6d8);
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&local_838);
    std::__cxx11::string::~string(local_608);
  }
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffff6d8 >> 0x20);
  if (local_b8 == 0) {
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x9b2,"AsyncReadApt",logWARN,
             "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
            );
    }
    CreateMsgWindow(8.0,logWARN,
                    "Could not open ANY apt.dat file. No runway/taxiway info available to guide ground traffic."
                   );
    local_358 = 1;
  }
  else {
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 2) {
      in_stack_fffffffffffff6e4 = local_b8;
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
                      *)0x1a155f);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x9b7,"AsyncReadApt",logINFO,
             "Done reading from %d apt.dat files, have now %d airports",
             (ulong)in_stack_fffffffffffff6e4,CONCAT44(uVar8,(int)sVar7));
    }
    local_358 = 0;
  }
  std::ifstream::~ifstream(local_2c8);
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  return;
}

Assistant:

void AsyncReadApt (positionTy ctr, double radius)
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ReadApt", LC_ALL_MASK);

    static size_t lenSceneryLnBegin = strlen(APTDAT_SCENERY_LN_BEGIN);
    
    // To avoid costly distance calculations we define a bounding box
    // just by calculating lat/lon values north/east/south/west of given pos
    // and include all airports with coordinates falling into it
    const boundingBoxTy box (ctr, radius);
    
    // --- Cleanup first: Remove too far away airports ---
    PurgeApt(box);
    
    // --- Add new airports ---
    // Count the number of files we have accessed
    int cntFiles = 0;
    bool bLooksLikeXP12 = false;            // XP12 Alpha introduced the *GLOBAL AIRPORTS* entry

    // Try opening scenery_packs.ini
    std::ifstream fScenery (LTCalcFullPath(APTDAT_SCENERY_PACKS));
    while (!bStopThread && fScenery.good() && fScenery.is_open())
    {
        // read a line from scenery_packs.ini
        std::string lnScenery;
        safeGetline(fScenery, lnScenery);
        
        // we only process lines starting with "SCENERY_PACK ",
        // ie. we skip any header info and also lines with SCENERY_PACK_DISABLED
        if (lnScenery.length() <= lenSceneryLnBegin ||
            lnScenery.substr(0,lenSceneryLnBegin) != APTDAT_SCENERY_LN_BEGIN)
            continue;

        // Remove the SCENERY_PACK part
        lnScenery.erase(0, lenSceneryLnBegin);

        // Starting with XP12 Alpha there's a special entry we can't read right here but need to take care of later
        if (lnScenery == APTDAT_SCENERY_GLOBAL_APTS) {
            bLooksLikeXP12 = true;
            continue;
        }

        // the remainder is a path into X-Plane's main folder
        lnScenery = LTCalcFullPath(lnScenery);      // make it a full path
        lnScenery += APTDAT_SCENERY_ADD_LOC;        // add the location to the actual `apt.dat` file
        
        // open that apt.dat
        std::ifstream fIn (lnScenery);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading apt.dat from %s", lnScenery.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }
        
        // problem was not just "not found" (which we ignore for scenery packs) or eof?
        if (!fIn && errno != ENOENT && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    lnScenery.c_str(), sErr);
        }
        
        fIn.close();

    } // processing scenery_packs.ini
    
    // Last but not least we also process the global generic apt.dat file
    if (!bStopThread)
    {
        const std::string sFileName = LTCalcFullPath(bLooksLikeXP12 ? APTDAT_GLOBAL_AIRPORTS APTDAT_SCENERY_ADD_LOC : APTDAT_RESOURCES_DEFAULT APTDAT_SCENERY_ADD_LOC);
        std::ifstream fIn (sFileName);
        if (fIn.good() && fIn.is_open()) {
            LOG_MSG(logDEBUG, "Reading global apt.dat from %s", sFileName.c_str());
            ReadOneAptFile(fIn, box);
            cntFiles++;
        }

        // problem was not just eof?
        if (!fIn && !fIn.eof()) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_CFG_FILE_READ,
                    sFileName.c_str(), sErr);
        }
        
        fIn.close();
    }
    
    // Not successful in opening ANY apt.dat file?
    if (!cntFiles) {
        SHOW_MSG(logWARN, WARN_APTDAT_FAILED);
        return;
    }
    
    LOG_MSG(logINFO, "Done reading from %d apt.dat files, have now %d airports",
            cntFiles, (int)gmapApt.size());
}